

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

string * __thiscall
relive::formattedDate_abi_cxx11_(string *__return_storage_ptr__,relive *this,int64_t unixTimestamp)

{
  tm *ptVar1;
  time_t t;
  relive *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20 = this;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  ptVar1 = localtime((time_t *)&local_20);
  anon_unknown.dwarf_47df66::append2Digits(__return_storage_ptr__,ptVar1->tm_year / 100 + 0x13);
  anon_unknown.dwarf_47df66::append2Digits(__return_storage_ptr__,ptVar1->tm_year % 100);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  anon_unknown.dwarf_47df66::append2Digits(__return_storage_ptr__,ptVar1->tm_mon + 1);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  anon_unknown.dwarf_47df66::append2Digits(__return_storage_ptr__,ptVar1->tm_mday);
  return __return_storage_ptr__;
}

Assistant:

std::string formattedDate(int64_t unixTimestamp)
{
    std::string result;
    struct std::tm* ti = nullptr;
    std::time_t t = unixTimestamp;
    result.reserve(9);
    ti = localtime (&t);
    append2Digits(result, 19+ti->tm_year/100);
    append2Digits(result, ti->tm_year%100);
    result += '-';
    append2Digits(result, ti->tm_mon+1);
    result += '-';
    append2Digits(result, ti->tm_mday);
    return result;
}